

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Linear_Object_State_PDU::operator==
          (Linear_Object_State_PDU *this,Linear_Object_State_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Linear_Object_State_PDU *Value_local;
  Linear_Object_State_PDU *this_local;
  
  KVar1 = Object_State_Header::operator!=
                    (&this->super_Object_State_Header,&Value->super_Object_State_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if ((this->super_Object_State_Header).field_0x4b ==
           (Value->super_Object_State_Header).field_0x4b) {
    KVar1 = DATA_TYPE::SimulationIdentifier::operator!=(&this->m_ReqID,&Value->m_ReqID);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = DATA_TYPE::SimulationIdentifier::operator!=(&this->m_RecvID,&Value->m_RecvID);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        KVar1 = DATA_TYPE::ObjectType::operator!=(&this->m_ObjTyp,&Value->m_ObjTyp);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          bVar2 = std::operator!=(&this->m_vSegments,&Value->m_vSegments);
          if (bVar2) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Linear_Object_State_PDU::operator == ( const Linear_Object_State_PDU & Value ) const
{
    if( Object_State_Header::operator  != ( Value ) )             return false;
    if( m_ui8NumSegment                != Value.m_ui8NumSegment ) return false;
    if( m_ReqID                        != Value.m_ReqID )         return false;
    if( m_RecvID                       != Value.m_RecvID )        return false;
    if( m_ObjTyp                       != Value.m_ObjTyp )        return false;
    if( m_vSegments                    != Value.m_vSegments )     return false;
    return true;
}